

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphInternal.h
# Opt level: O0

ExpandMacroResult __thiscall
cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::PackagePreset>::operator()
          (PresetMacroExpander<cmCMakePresetsGraph::PackagePreset> *this,string *macroNamespace,
          string *macroName,string *macroOut,int version)

{
  bool bVar1;
  ulong uVar2;
  string local_88;
  string local_58;
  int local_34;
  string *psStack_30;
  int version_local;
  string *macroOut_local;
  string *macroName_local;
  string *macroNamespace_local;
  PresetMacroExpander<cmCMakePresetsGraph::PackagePreset> *this_local;
  
  local_34 = version;
  psStack_30 = macroOut;
  macroOut_local = macroName;
  macroName_local = macroNamespace;
  macroNamespace_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    bVar1 = std::operator==(macroOut_local,"presetName");
    if (bVar1) {
      std::__cxx11::string::operator+=
                ((string *)psStack_30,(string *)&(this->Preset->super_Preset).Name);
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"generator");
    if (bVar1) {
      if (((this->Preset->super_Preset).Hidden & 1U) == 0) {
        cmCMakePresetsGraph::GetGeneratorForPreset
                  (&local_58,this->Graph,&(this->Preset->super_Preset).Name);
        std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"fileDir");
    if (bVar1) {
      if (local_34 < 4) {
        return Error;
      }
      cmsys::SystemTools::GetParentDirectory
                (&local_88,&((this->Preset->super_Preset).OriginFile)->Filename);
      std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      return Ok;
    }
  }
  return Ignore;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int version) const override
  {
    if (macroNamespace.empty()) {
      if (macroName == "presetName") {
        macroOut += Preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!Preset.Hidden) {
          macroOut += Graph.GetGeneratorForPreset(Preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(Preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
    }
    return ExpandMacroResult::Ignore;
  }